

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O1

void __thiscall
FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay
          (FListMenuItemPlayerDisplay *this,FListMenuDescriptor *menu,int x,int y,PalEntry c1,
          PalEntry c2,bool np,FName *action)

{
  BYTE BVar1;
  ulong uVar2;
  FBackdropTexture *this_00;
  uint uVar3;
  int i;
  long lVar4;
  uint b;
  int iVar5;
  uint g;
  ulong uVar6;
  
  iVar5 = action->Index;
  (this->super_FListMenuItem).mXpos = x;
  (this->super_FListMenuItem).mYpos = y;
  (this->super_FListMenuItem).mAction.Index = iVar5;
  (this->super_FListMenuItem).mEnabled = true;
  (this->super_FListMenuItem)._vptr_FListMenuItem =
       (_func_int **)&PTR__FListMenuItemPlayerDisplay_006f2bf8;
  FRemapTable::FRemapTable(&this->mRemap,0x100);
  this->mOwner = menu;
  uVar2 = 0;
  uVar3 = 0;
  uVar6 = 0;
  lVar4 = 0;
  do {
    iVar5 = (int)(uVar2 / 0xff) + ((uint)c1.field_0 >> 0x10 & 0xff);
    g = uVar3 / 0xff + ((uint)c1.field_0 >> 8 & 0xff);
    b = (int)(uVar6 / 0xff) + ((uint)c1.field_0 & 0xff);
    BVar1 = FColorMatcher::Pick(&ColorMatcher,iVar5,g,b);
    (this->mRemap).Remap[lVar4] = BVar1;
    (this->mRemap).Palette[lVar4].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         (b & 0xff | (g & 0xff) << 8 | iVar5 * 0x10000 | 0xff000000);
    lVar4 = lVar4 + 1;
    uVar6 = (ulong)((int)uVar6 + ((uint)c2.field_0 & 0xff));
    uVar3 = uVar3 + ((uint)c2.field_0 >> 8 & 0xff);
    uVar2 = (ulong)((int)uVar2 + ((uint)c2.field_0 >> 0x10 & 0xff));
  } while (lVar4 != 0x100);
  this_00 = (FBackdropTexture *)operator_new(0x5e78);
  FBackdropTexture::FBackdropTexture(this_00);
  this->mBackdrop = (FTexture *)this_00;
  this->mPlayerClass = (FPlayerClass *)0x0;
  this->mPlayerState = (FState *)0x0;
  this->mNoportrait = np;
  *(undefined8 *)&this->mRotation = 0;
  this->mRandomClass = 0;
  this->mRandomTimer = 0;
  this->mClassNum = -1;
  return;
}

Assistant:

FListMenuItemPlayerDisplay::FListMenuItemPlayerDisplay(FListMenuDescriptor *menu, int x, int y, PalEntry c1, PalEntry c2, bool np, FName action)
: FListMenuItem(x, y, action)
{
	mOwner = menu;

	for (int i = 0; i < 256; i++)
	{
		int r = c1.r + c2.r * i / 255;
		int g = c1.g + c2.g * i / 255;
		int b = c1.b + c2.b * i / 255;
		mRemap.Remap[i] = ColorMatcher.Pick (r, g, b);
		mRemap.Palette[i] = PalEntry(255, r, g, b);
	}
	mBackdrop = new FBackdropTexture;
	mPlayerClass = NULL;
	mPlayerState = NULL;
	mNoportrait = np;
	mMode = 0;
	mRotation = 0;
	mTranslate = false;
	mSkin = 0;
	mRandomClass = 0;
	mRandomTimer = 0;
	mClassNum = -1;
}